

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O1

void __thiscall
ModelFlattening_resolveFlattenNonCircularImportsUnits_Test::TestBody
          (ModelFlattening_resolveFlattenNonCircularImportsUnits_Test *this)

{
  long lVar1;
  string *psVar2;
  byte bVar3;
  char cVar4;
  char *pcVar5;
  ModelPtr flatModel;
  AssertionResult gtest_ar_;
  ModelPtr model;
  UnitsPtr importedUnit;
  UnitsPtr unitsWithImportedUnit;
  ModelPtr importModel;
  ImportSourcePtr importSource;
  UnitsPtr perBecquerel;
  UnitsPtr fancyUnits;
  ImporterPtr importer;
  AssertionResult local_d8;
  long local_c8 [2];
  long *local_b8;
  unsigned_long local_b0;
  internal local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  shared_ptr *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  long local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  string *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  shared_ptr *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  StandardUnit local_48 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Importer::create(SUB81(local_28,0));
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"model","");
  libcellml::Model::create((string *)&local_98);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"importModel","");
  libcellml::Model::create((string *)&local_68);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"one_imported_unit","");
  libcellml::Units::create((string *)&local_78);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  psVar2 = local_78;
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"metre","");
  libcellml::Units::addUnit(psVar2);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"importedUnit","");
  libcellml::Units::addUnit(local_78);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"fancyUnits","");
  libcellml::Units::create((string *)&local_38);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"per_becquerel","");
  libcellml::Units::addUnit(local_38);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"per_becquerel","");
  libcellml::Units::create((string *)local_48);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  pcVar5 = "";
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"","");
  libcellml::Units::addUnit(local_48[0],-1.0,(string *)0x1);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  libcellml::Model::addUnits(local_68);
  libcellml::Model::addUnits(local_68);
  libcellml::ImportSource::create();
  psVar2 = local_58;
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"here.cellml","");
  libcellml::ImportSource::setUrl(psVar2);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  libcellml::ImportSource::setModel((shared_ptr *)local_58);
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"importedUnit","");
  libcellml::Units::create((string *)&local_88);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  lVar1 = local_88;
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"fancyUnits","");
  libcellml::ImportedEntity::setImportReference((string *)(lVar1 + 0x10));
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_88 + 0x10));
  libcellml::Model::addUnits(local_98);
  libcellml::Model::addUnits(local_98);
  bVar3 = libcellml::Model::hasUnresolvedImports();
  local_a8[0] = (internal)(bVar3 ^ 1);
  local_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(char *)local_a8,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x38e,(char *)local_d8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if ((long *)local_d8._0_8_ != local_c8) {
      operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
    }
    if (local_b8 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_b8 != (long *)0x0)) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Importer::flattenModel((shared_ptr *)&local_d8);
  local_b8 = (long *)0x0;
  local_b0 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_a8,"size_t(0)","importer->issueCount()",(unsigned_long *)&local_b8,&local_b0);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x391,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_b8 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_b8 != (long *)0x0)) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_d8.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.message_.ptr_);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(ModelFlattening, resolveFlattenNonCircularImportsUnits)
{
    auto importer = libcellml::Importer::create();
    auto model = libcellml::Model::create("model");
    auto importModel = libcellml::Model::create("importModel");

    auto unitsWithImportedUnit = libcellml::Units::create("one_imported_unit");
    unitsWithImportedUnit->addUnit("metre");
    unitsWithImportedUnit->addUnit("importedUnit");

    auto fancyUnits = libcellml::Units::create("fancyUnits");
    fancyUnits->addUnit("per_becquerel");

    auto perBecquerel = libcellml::Units::create("per_becquerel");
    perBecquerel->addUnit(libcellml::Units::StandardUnit::BECQUEREL, -1.0);

    importModel->addUnits(fancyUnits);
    importModel->addUnits(perBecquerel);

    auto importSource = libcellml::ImportSource::create();
    importSource->setUrl("here.cellml");
    importSource->setModel(importModel);

    auto importedUnit = libcellml::Units::create("importedUnit");
    importedUnit->setImportReference("fancyUnits");
    importedUnit->setImportSource(importSource);

    model->addUnits(unitsWithImportedUnit);
    model->addUnits(importedUnit);

    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ(size_t(0), importer->issueCount());
}